

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeNext(BtCursor *pCur)

{
  uint uVar1;
  MemPage *pMVar2;
  byte bVar3;
  int iVar4;
  ushort uVar5;
  undefined8 in_RSI;
  
  bVar3 = pCur->eState;
  if (bVar3 == 0) {
LAB_001558c2:
    pMVar2 = pCur->pPage;
    uVar5 = pCur->ix + 1;
    pCur->ix = uVar5;
    if ((sqlite3Config.xTestCallback == (_func_int_int *)0x0) ||
       (iVar4 = (*sqlite3Config.xTestCallback)(0x19c), iVar4 == 0)) {
      if (pMVar2->isInit != '\0') {
        if (uVar5 < pMVar2->nCell) {
          if (pMVar2->leaf == '\0') {
LAB_00155991:
            iVar4 = moveToLeftmost(pCur);
            return iVar4;
          }
        }
        else {
          if (pMVar2->leaf == '\0') {
            uVar1 = *(uint *)(pMVar2->aData + (ulong)pMVar2->hdrOffset + 8);
            iVar4 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                     | uVar1 << 0x18);
            if (iVar4 != 0) {
              return iVar4;
            }
            goto LAB_00155991;
          }
          do {
            if (pCur->iPage == '\0') {
              pCur->eState = '\x01';
              return 0x65;
            }
            moveToParent(pCur);
          } while (pCur->pPage->nCell <= pCur->ix);
          if (pCur->pPage->intKey != '\0') {
            iVar4 = sqlite3BtreeNext(pCur,(int)in_RSI);
            return iVar4;
          }
        }
        goto LAB_00155909;
      }
    }
    else {
      pMVar2->isInit = '\0';
    }
    iVar4 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12d00,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  else {
    if (2 < bVar3) {
      iVar4 = btreeRestoreCursorPosition(pCur);
      if (iVar4 != 0) {
        return iVar4;
      }
      bVar3 = pCur->eState;
    }
    if (bVar3 == 1) {
      return 0x65;
    }
    if ((bVar3 != 2) || (pCur->eState = '\0', pCur->skipNext < 1)) goto LAB_001558c2;
LAB_00155909:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->eState==CURSOR_SKIPNEXT ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  idx = ++pCur->ix;
  if( sqlite3FaultSim(412) ) pPage->isInit = 0;
  if( !pPage->isInit ){
    return SQLITE_CORRUPT_BKPT;
  }

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
      pPage = pCur->pPage;
    }while( pCur->ix>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, 0);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}